

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

uint8_t * __thiscall
proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator::_InternalSerialize
          (TestParsingMergeLite_RepeatedFieldsGenerator *this,uint8_t *target,
          EpsCopyOutputStream *stream)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  RepeatedPtrField<proto2_unittest::TestAllTypesLite> *pRVar4;
  const_reference pTVar5;
  uint8_t *puVar6;
  RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group1> *this_00;
  const_reference value;
  RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group2> *this_01;
  const_reference value_00;
  void *data;
  TestAllTypesLite *repfield_4;
  uint n_6;
  uint i_6;
  TestAllTypesLite *repfield_3;
  uint n_5;
  uint i_5;
  uint n_4;
  uint i_4;
  uint n_3;
  uint i_3;
  TestAllTypesLite *repfield_2;
  uint n_2;
  uint i_2;
  TestAllTypesLite *repfield_1;
  uint n_1;
  uint i_1;
  TestAllTypesLite *repfield;
  uint local_30;
  uint n;
  uint i;
  uint32_t cached_has_bits;
  TestParsingMergeLite_RepeatedFieldsGenerator *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  TestParsingMergeLite_RepeatedFieldsGenerator *this_local;
  
  local_30 = 0;
  uVar2 = _internal_field1_size(this);
  stream_local = (EpsCopyOutputStream *)target;
  for (; local_30 < uVar2; local_30 = local_30 + 1) {
    pRVar4 = _internal_field1(this);
    pTVar5 = google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite>::Get
                       (pRVar4,local_30);
    iVar3 = TestAllTypesLite::GetCachedSize(pTVar5);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (1,&pTVar5->super_MessageLite,iVar3,(uint8_t *)stream_local,stream);
  }
  repfield_1._4_4_ = 0;
  uVar2 = _internal_field2_size(this);
  for (; repfield_1._4_4_ < uVar2; repfield_1._4_4_ = repfield_1._4_4_ + 1) {
    pRVar4 = _internal_field2(this);
    pTVar5 = google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite>::Get
                       (pRVar4,repfield_1._4_4_);
    iVar3 = TestAllTypesLite::GetCachedSize(pTVar5);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (2,&pTVar5->super_MessageLite,iVar3,(uint8_t *)stream_local,stream);
  }
  repfield_2._4_4_ = 0;
  uVar2 = _internal_field3_size(this);
  for (; repfield_2._4_4_ < uVar2; repfield_2._4_4_ = repfield_2._4_4_ + 1) {
    pRVar4 = _internal_field3(this);
    pTVar5 = google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite>::Get
                       (pRVar4,repfield_2._4_4_);
    iVar3 = TestAllTypesLite::GetCachedSize(pTVar5);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (3,&pTVar5->super_MessageLite,iVar3,(uint8_t *)stream_local,stream);
  }
  i_4 = 0;
  uVar2 = _internal_group1_size(this);
  for (; i_4 < uVar2; i_4 = i_4 + 1) {
    puVar6 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    this_00 = _internal_group1(this);
    value = google::protobuf::
            RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group1>::
            Get(this_00,i_4);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteGroup
                             (10,&value->super_MessageLite,puVar6,stream);
  }
  i_5 = 0;
  uVar2 = _internal_group2_size(this);
  for (; i_5 < uVar2; i_5 = i_5 + 1) {
    puVar6 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    this_01 = _internal_group2(this);
    value_00 = google::protobuf::
               RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group2>
               ::Get(this_01,i_5);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteGroup
                             (0x14,&value_00->super_MessageLite,puVar6,stream);
  }
  repfield_3._4_4_ = 0;
  uVar2 = _internal_ext1_size(this);
  for (; repfield_3._4_4_ < uVar2; repfield_3._4_4_ = repfield_3._4_4_ + 1) {
    pRVar4 = _internal_ext1(this);
    pTVar5 = google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite>::Get
                       (pRVar4,repfield_3._4_4_);
    iVar3 = TestAllTypesLite::GetCachedSize(pTVar5);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (1000,&pTVar5->super_MessageLite,iVar3,(uint8_t *)stream_local,stream);
  }
  repfield_4._4_4_ = 0;
  uVar2 = _internal_ext2_size(this);
  for (; repfield_4._4_4_ < uVar2; repfield_4._4_4_ = repfield_4._4_4_ + 1) {
    pRVar4 = _internal_ext2(this);
    pTVar5 = google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite>::Get
                       (pRVar4,repfield_4._4_4_);
    iVar3 = TestAllTypesLite::GetCachedSize(pTVar5);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (0x3e9,&pTVar5->super_MessageLite,iVar3,(uint8_t *)stream_local,stream)
    ;
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    data = (void *)std::__cxx11::string::data();
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    iVar3 = std::__cxx11::string::size();
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteRaw
                             (stream,data,iVar3,(uint8_t *)stream_local);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestParsingMergeLite_RepeatedFieldsGenerator::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestParsingMergeLite_RepeatedFieldsGenerator& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestParsingMergeLite.RepeatedFieldsGenerator)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated .proto2_unittest.TestAllTypesLite field1 = 1;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_field1_size());
       i < n; i++) {
    const auto& repfield = this_._internal_field1().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            1, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .proto2_unittest.TestAllTypesLite field2 = 2;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_field2_size());
       i < n; i++) {
    const auto& repfield = this_._internal_field2().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            2, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .proto2_unittest.TestAllTypesLite field3 = 3;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_field3_size());
       i < n; i++) {
    const auto& repfield = this_._internal_field3().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            3, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .proto2_unittest.TestParsingMergeLite.RepeatedFieldsGenerator.Group1 group1 = 10 [features = {
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_group1_size());
       i < n; i++) {
    target = stream->EnsureSpace(target);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteGroup(
            10, this_._internal_group1().Get(i),
            target, stream);
  }

  // repeated .proto2_unittest.TestParsingMergeLite.RepeatedFieldsGenerator.Group2 group2 = 20 [features = {
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_group2_size());
       i < n; i++) {
    target = stream->EnsureSpace(target);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteGroup(
            20, this_._internal_group2().Get(i),
            target, stream);
  }

  // repeated .proto2_unittest.TestAllTypesLite ext1 = 1000;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_ext1_size());
       i < n; i++) {
    const auto& repfield = this_._internal_ext1().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            1000, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .proto2_unittest.TestAllTypesLite ext2 = 1001;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_ext2_size());
       i < n; i++) {
    const auto& repfield = this_._internal_ext2().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            1001, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(
        this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).data(),
        static_cast<int>(this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestParsingMergeLite.RepeatedFieldsGenerator)
  return target;
}